

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

void __thiscall QRelation::populateModel(QRelation *this)

{
  QObject *parent;
  bool bVar1;
  QRelatedTableModel *pQVar2;
  undefined4 *puVar3;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar4;
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid(this);
  if ((bVar1) && (this->model == (QRelatedTableModel *)0x0)) {
    pQVar2 = (QRelatedTableModel *)operator_new(0x20);
    parent = (QObject *)this->m_parent;
    QSqlTableModel::database((QSqlTableModel *)&local_50);
    QRelatedTableModel::QRelatedTableModel(pQVar2,this,parent,(QSqlDatabase *)&local_50);
    this->model = pQVar2;
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_50);
    pQVar2 = this->model;
    local_50.d = (this->rel).tName.d.d;
    local_50.ptr = (this->rel).tName.d.ptr;
    local_50.size = (this->rel).tName.d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (**(code **)(*(long *)&(pQVar2->super_QSqlTableModel).super_QSqlQueryModel + 0x1a0))
              (pQVar2,&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    (**(code **)(*(long *)&(this->model->super_QSqlTableModel).super_QSqlQueryModel + 0x1c8))();
    pQVar2 = this->model;
    local_50.d = (Data *)QAbstractItemModel::dataChanged;
    local_50.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x18);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:160:74),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(QRelation **)(puVar3 + 4) = this;
    QObject::connectImpl
              (local_58,(void **)pQVar2,(QObject *)&local_50,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)((ulong)uVar4 << 0x20),(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    pQVar2 = this->model;
    local_50.d = (Data *)QAbstractItemModel::rowsRemoved;
    local_50.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x18);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:165:74),_QtPrivate::List<>,_void>
         ::impl;
    *(QRelation **)(puVar3 + 4) = this;
    QObject::connectImpl
              (local_60,(void **)pQVar2,(QObject *)&local_50,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pQVar2 = this->model;
    local_50.d = (Data *)QAbstractItemModel::rowsInserted;
    local_50.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x18);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/sql/models/qsqlrelationaltablemodel.cpp:169:75),_QtPrivate::List<>,_void>
         ::impl;
    *(QRelation **)(puVar3 + 4) = this;
    QObject::connectImpl
              (local_68,(void **)pQVar2,(QObject *)&local_50,(void **)pQVar2,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRelation::populateModel()
{
    if (!isValid())
        return;
    Q_ASSERT(m_parent != nullptr);

    if (!model) {
        model = new QRelatedTableModel(this, m_parent, m_parent->database());
        model->setTable(rel.tableName());
        model->select();
        QObject::connect(model, &QAbstractItemModel::dataChanged, model, [&](const QModelIndex &tl, const QModelIndex &br)
        {
            if (tl.column() >= col && br.column() <= col)
                clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsRemoved, model, [&]()
        {
            clearDictionary();
        });
        QObject::connect(model, &QAbstractItemModel::rowsInserted, model, [&]()
        {
            clearDictionary();
        });
    }
}